

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QList<QtDependency> *
findFilesRecursively(QList<QtDependency> *__return_storage_ptr__,Options *options,QString *fileName)

{
  pointer pQVar1;
  Data *pDVar2;
  QtDependency *pQVar3;
  qsizetype qVar4;
  char cVar5;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> _Var6;
  QString *pQVar7;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&> local_a0;
  QFileInfo info;
  QArrayDataPointer<QtDependency> local_78;
  QFileInfo info_1;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QtDependency *)0x0;
  pQVar7 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pQVar7 == pQVar1) {
      pQVar7 = &options->qtInstallDirectory;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<QString_const*,std::vector<QString,std::allocator<QString>>>,__gnu_cxx::__ops::_Iter_equals_val<QString_const>>
                        ((options->extraPrefixDirs).
                         super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (options->extraPrefixDirs).
                         super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                         super__Vector_impl_data._M_finish,pQVar7);
      if (_Var6._M_current ==
          (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        _info_1 = (QString *)0xaaaaaaaaaaaaaaaa;
        local_a0.a.b.m_size = 1;
        local_a0.a.b.m_data = "/";
        local_a0.a.a = pQVar7;
        local_a0.b = fileName;
        QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&>::
        convertTo<QString>((QString *)&local_50,&local_a0);
        QFileInfo::QFileInfo(&info_1,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        _info = 0xaaaaaaaaaaaaaaaa;
        local_50.ptr = (char16_t *)0x1;
        local_50.size = 0x13a10c;
        local_50.d = (Data *)pQVar7;
        QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                  ((QString *)&local_a0,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_50)
        ;
        QFileInfo::QFileInfo(&info,(QString *)&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
        QFileInfo::absolutePath();
        findFilesRecursively((QList<QtDependency> *)&local_a0,options,&info_1,(QString *)&local_50);
        QList<QtDependency>::append
                  ((QList<QtDependency> *)&local_78,(QList<QtDependency> *)&local_a0);
        QArrayDataPointer<QtDependency>::~QArrayDataPointer
                  ((QArrayDataPointer<QtDependency> *)&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QFileInfo::~QFileInfo(&info);
        QFileInfo::~QFileInfo(&info_1);
      }
      qVar4 = local_78.size;
      pQVar3 = local_78.ptr;
      pDVar2 = local_78.d;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QtDependency *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pQVar3;
      local_78.size = 0;
      (__return_storage_ptr__->d).size = qVar4;
LAB_0011518a:
      QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    _info = 0xaaaaaaaaaaaaaaaa;
    local_50.ptr = (char16_t *)CONCAT62(local_50.ptr._2_6_,0x2f);
    local_50.d = (Data *)pQVar7;
    local_50.size = (qsizetype)fileName;
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_a0,
               (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
               &local_50);
    QFileInfo::QFileInfo(&info,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    cVar5 = QFileInfo::exists();
    if (cVar5 != '\0') {
      cVar5 = QFileInfo::isDir();
      if (cVar5 == '\0') {
        local_50.ptr = (char16_t *)CONCAT62(local_50.ptr._2_6_,0x2f);
        local_50.d = (Data *)pQVar7;
        QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                  ((QString *)&local_a0,(QStringBuilder<const_QString_&,_char16_t> *)&local_50);
        findFilesRecursively(__return_storage_ptr__,options,&info,(QString *)&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
        QFileInfo::~QFileInfo(&info);
        goto LAB_0011518a;
      }
      _info_1 = pQVar7;
      QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                ((QString *)&local_50,(QStringBuilder<const_QString_&,_char16_t> *)&info_1);
      findFilesRecursively((QList<QtDependency> *)&local_a0,options,&info,(QString *)&local_50);
      QList<QtDependency>::append((QList<QtDependency> *)&local_78,(QList<QtDependency> *)&local_a0)
      ;
      QArrayDataPointer<QtDependency>::~QArrayDataPointer
                ((QArrayDataPointer<QtDependency> *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
    QFileInfo::~QFileInfo(&info);
    pQVar7 = pQVar7 + 1;
  } while( true );
}

Assistant:

QList<QtDependency> findFilesRecursively(const Options &options, const QString &fileName)
{
    // We try to find the fileName in extraPrefixDirs first. The function behaves differently
    // depending on what the fileName points to. If fileName is a file then we try to find the
    // first occurrence in extraPrefixDirs and return this file. If fileName is directory function
    // iterates over it and looks for deployment artifacts in each 'extraPrefixDirs' entry.
    // Also we assume that if the fileName is recognized as a directory once it will be directory
    // for every 'extraPrefixDirs' entry.
    QList<QtDependency> deps;
    for (const auto &prefix : options.extraPrefixDirs) {
        QFileInfo info(prefix + u'/' + fileName);
        if (info.exists()) {
            if (info.isDir())
                deps.append(findFilesRecursively(options, info, prefix + u'/'));
            else
                return findFilesRecursively(options, info, prefix + u'/');
        }
    }

    // Usually android deployment settings contain Qt install directory in extraPrefixDirs.
    if (std::find(options.extraPrefixDirs.begin(), options.extraPrefixDirs.end(),
                  options.qtInstallDirectory) == options.extraPrefixDirs.end()) {
        QFileInfo info(options.qtInstallDirectory + "/"_L1 + fileName);
        QFileInfo rootPath(options.qtInstallDirectory + "/"_L1);
        deps.append(findFilesRecursively(options, info, rootPath.absolutePath()));
    }
    return deps;
}